

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O2

void __thiscall
Js::Utf8SourceInfo::Utf8SourceInfo
          (Utf8SourceInfo *this,ISourceHolder *mappableSource,int32 cchLength,SRCINFO *srcInfo,
          DWORD_PTR secondaryHostSourceContext,ScriptContext *scriptContext,bool isLibraryCode,
          Var scriptSource)

{
  Type *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type TVar2;
  
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01379c78;
  this->m_cchLength = cchLength;
  this_00 = &this->sourceHolder;
  Memory::WriteBarrierPtr<Js::ISourceHolder>::WriteBarrierSet(this_00,mappableSource);
  (this->functionBodyDictionary).ptr =
       (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
        *)0x0;
  (this->m_deferredFunctionsDictionary).ptr =
       (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
        *)0x0;
  (this->topLevelFunctionInfoList).ptr =
       (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       0x0;
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->boundedPropertyRecordHashSet).
                    super_BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,scriptContext->recycler,0);
  (this->m_debugDocument).ptr = (DebugDocument *)0x0;
  Memory::WriteBarrierPtr<const_SRCINFO>::WriteBarrierSet(&this->m_srcInfo,srcInfo);
  this->m_secondaryHostSourceContext = secondaryHostSourceContext;
  (this->debugModeSource).ptr = (uchar *)0x0;
  this->debugModeSourceLength = 0;
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierSet(&this->m_scriptContext,scriptContext);
  (this->m_lineOffsetCache).ptr = (LineOffsetCache *)0x0;
  (this->callerUtf8SourceInfo).ptr = (Utf8SourceInfo *)0x0;
  this->field_0xa8 = this->field_0xa8 & 0x80 | isLibraryCode << 2;
  TVar2 = scriptContext->threadContext->sourceInfoCount + 1;
  scriptContext->threadContext->sourceInfoCount = TVar2;
  this->m_sourceInfoId = TVar2;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->sourceRef,scriptSource);
  iVar1 = (*(this_00->ptr->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xb])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*(this_00->ptr->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])(this_00->ptr,L"Entering Debug Mode");
    Memory::WriteBarrierPtr<const_unsigned_char>::WriteBarrierSet
              (&this->debugModeSource,(uchar *)CONCAT44(extraout_var,iVar1));
    iVar1 = (*(this_00->ptr->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(this_00->ptr,L"Entering Debug Mode");
    this->debugModeSourceLength = CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*(((this->sourceHolder).ptr)->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[10])();
    this->field_0xa8 =
         this->field_0xa8 & 0xdf | ((byte)iVar1 | (this->debugModeSource).ptr == (uchar *)0x0) << 5;
  }
  return;
}

Assistant:

Utf8SourceInfo::Utf8SourceInfo(ISourceHolder* mappableSource, int32 cchLength,
        SRCINFO const* srcInfo, DWORD_PTR secondaryHostSourceContext,
        ScriptContext* scriptContext, bool isLibraryCode, Js::Var scriptSource):
        sourceHolder(mappableSource),
        m_cchLength(cchLength),
        m_srcInfo(srcInfo),
        m_secondaryHostSourceContext(secondaryHostSourceContext),
#ifdef ENABLE_SCRIPT_DEBUGGING
        m_debugDocument(nullptr),
#endif
        m_sourceInfoId(scriptContext->GetThreadContext()->NewSourceInfoNumber()),
        m_isCesu8(false),
        m_isLibraryCode(isLibraryCode),
        m_isXDomain(false),
        m_isXDomainString(false),
        m_scriptContext(scriptContext),
        m_lineOffsetCache(nullptr),
        m_deferredFunctionsDictionary(nullptr),
        m_deferredFunctionsInitialized(false),
        topLevelFunctionInfoList(nullptr),
#ifdef ENABLE_SCRIPT_DEBUGGING
        debugModeSource(nullptr),
        debugModeSourceIsEmpty(false),
        debugModeSourceLength(0),
        m_isInDebugMode(false),
#endif
        callerUtf8SourceInfo(nullptr),
        boundedPropertyRecordHashSet(scriptContext->GetRecycler())
#ifndef NTBUILD
        ,sourceRef(scriptSource)
#endif
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!sourceHolder->IsDeferrable())
        {
            this->debugModeSource = this->sourceHolder->GetSource(_u("Entering Debug Mode"));
            this->debugModeSourceLength = this->sourceHolder->GetByteLength(_u("Entering Debug Mode"));
            this->debugModeSourceIsEmpty = !this->HasSource() || this->debugModeSource == nullptr;
        }
#endif
    }